

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::TemplatedIndexOfHelper<true,Js::JavascriptNativeFloatArray,unsigned_int>
              (JavascriptNativeFloatArray *pArr,Var search,uint fromIndex,uint toIndex,
              ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  JavascriptBoolean *pJVar2;
  JavascriptBoolean *pJVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RecyclableObject *this;
  Type TVar8;
  uint i;
  Var local_40;
  Var element;
  
  local_40 = (Var)0x0;
  element._7_1_ = TaggedInt::Is(search);
  if (search == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00a6d2b0;
    *puVar7 = 0;
  }
  bVar5 = TaggedInt::Is(search);
  TVar8 = TypeIds_FirstNumberType;
  if ((ulong)search >> 0x32 == 0 && !bVar5) {
    this = UnsafeVarTo<Js::RecyclableObject>(search);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00a6d2b0;
      *puVar7 = 0;
    }
    TVar8 = ((this->type).ptr)->typeId;
    if (0x57 < (int)TVar8) {
      BVar6 = RecyclableObject::IsExternal(this);
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        TVar8 = TypeIds_FirstNumberType;
        if (!bVar5) {
LAB_00a6d2b0:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
      }
      else {
        TVar8 = TypeIds_FirstNumberType;
      }
    }
  }
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pJVar2 = (pJVar1->super_JavascriptLibraryBase).booleanTrue.ptr;
  pJVar3 = (pJVar1->super_JavascriptLibraryBase).booleanFalse.ptr;
  do {
    if (toIndex <= fromIndex) {
      return pJVar3;
    }
    BVar6 = TryTemplatedGetItem<Js::JavascriptNativeFloatArray,unsigned_int>
                      ((RecyclableObject *)pArr,fromIndex,&local_40,scriptContext,false);
    if (BVar6 == 0) {
      if (TVar8 == TypeIds_Undefined) {
        return pJVar2;
      }
    }
    else if ((element._7_1_ == '\0') || (bVar5 = TaggedInt::Is(local_40), !bVar5)) {
      bVar5 = JavascriptConversion::SameValueCommon<true>(local_40,search);
      if (bVar5) {
        return pJVar2;
      }
    }
    else if (local_40 == search) {
      return pJVar2;
    }
    fromIndex = fromIndex + 1;
  } while( true );
}

Assistant:

Var JavascriptArray::TemplatedIndexOfHelper(T * pArr, Var search, P fromIndex, P toIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);
        bool doUndefinedSearch = includesAlgorithm && JavascriptOperators::GetTypeId(search) == TypeIds_Undefined;

        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        //Consider: enumerating instead of walking all indices
        for (P i = fromIndex; i < toIndex; i++)
        {
            if (!TryTemplatedGetItem<T>(pArr, i, &element, scriptContext, !includesAlgorithm))
            {
                if (doUndefinedSearch)
                {
                    return trueValue;
                }
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return includesAlgorithm? trueValue : JavascriptNumber::ToVar(i, scriptContext);
                }
                continue;
            }

            if (includesAlgorithm)
            {
                //Array.prototype.includes
                if (JavascriptConversion::SameValueZero(element, search))
                {
                    return trueValue;
                }
            }
            else
            {
                //Array.prototype.indexOf
                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return JavascriptNumber::ToVar(i, scriptContext);
                }
            }
        }

        return includesAlgorithm ? falseValue :  TaggedInt::ToVarUnchecked(-1);
    }